

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pagerFixMaplimit(Pager *pPager)

{
  long local_20;
  sqlite3_int64 sz;
  sqlite3_file *fd;
  Pager *pPager_local;
  
  sz = (sqlite3_int64)pPager->fd;
  if ((((sqlite3_file *)sz)->pMethods != (sqlite3_io_methods *)0x0) &&
     (2 < ((sqlite3_file *)sz)->pMethods->iVersion)) {
    local_20 = pPager->szMmap;
    pPager->bUseFetch = 0 < local_20;
    fd = (sqlite3_file *)pPager;
    setGetterMethod(pPager);
    sqlite3OsFileControlHint((sqlite3_file *)fd[9].pMethods,0x12,&local_20);
  }
  return;
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) && fd->pMethods->iVersion>=3 ){
    sqlite3_int64 sz;
    sz = pPager->szMmap;
    pPager->bUseFetch = (sz>0);
    setGetterMethod(pPager);
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}